

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_Io * handleIo_duplicate(PHYSFS_Io *io)

{
  long *plVar1;
  FileHandle *pFVar2;
  undefined4 uVar3;
  FileHandle *pFVar4;
  PHYSFS_Io *pPVar5;
  PHYSFS_Io *pPVar6;
  FileHandle **ppFVar7;
  long lVar8;
  byte bVar9;
  
  bVar9 = 0;
  plVar1 = (long *)io->opaque;
  pFVar4 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
  if (pFVar4 == (FileHandle *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    pFVar4->bufpos = 0;
    pFVar4->next = (__PHYSFS_FILEHANDLE__ *)0x0;
    pFVar4->bufsize = 0;
    pFVar4->buffill = 0;
    pFVar4->dirHandle = (DirHandle *)0x0;
    pFVar4->buffer = (PHYSFS_uint8 *)0x0;
    pFVar4->io = (PHYSFS_Io *)0x0;
    *(undefined8 *)&pFVar4->forReading = 0;
    pPVar5 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
    if (pPVar5 == (PHYSFS_Io *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      pPVar5 = pFVar4->io;
      if (pPVar5 != (PHYSFS_Io *)0x0) {
        (*pPVar5->destroy)(pPVar5);
      }
    }
    else {
      pPVar6 = (PHYSFS_Io *)(**(code **)(*plVar1 + 0x38))();
      pFVar4->io = pPVar6;
      if (pPVar6 != (PHYSFS_Io *)0x0) {
        pFVar4->forReading = (PHYSFS_uint8)plVar1[1];
        pFVar4->dirHandle = (DirHandle *)plVar1[2];
        __PHYSFS_platformGrabMutex(stateLock);
        ppFVar7 = &openReadList;
        if (pFVar4->forReading == '\0') {
          ppFVar7 = &openWriteList;
        }
        pFVar2 = *ppFVar7;
        *ppFVar7 = pFVar4;
        pFVar4->next = pFVar2;
        __PHYSFS_platformReleaseMutex(stateLock);
        pPVar6 = pPVar5;
        for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar3 = *(undefined4 *)&io->field_0x4;
          pPVar6->version = io->version;
          *(undefined4 *)&pPVar6->field_0x4 = uVar3;
          io = (PHYSFS_Io *)((long)io + (ulong)bVar9 * -0x10 + 8);
          pPVar6 = (PHYSFS_Io *)((long)pPVar6 + (ulong)bVar9 * -0x10 + 8);
        }
        pPVar5->opaque = pFVar4;
        return pPVar5;
      }
    }
    if (pFVar4->buffer != (PHYSFS_uint8 *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(pFVar4->buffer);
    }
    (*__PHYSFS_AllocatorHooks.Free)(pFVar4);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *handleIo_duplicate(PHYSFS_Io *io)
{
    /*
     * There's no duplicate at the PHYSFS_File level, so we break the
     *  abstraction. We're allowed to: we're physfs.c!
     */
    FileHandle *origfh = (FileHandle *) io->opaque;
    FileHandle *newfh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
    PHYSFS_Io *retval = NULL;

    GOTO_IF(!newfh, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
    memset(newfh, '\0', sizeof (*newfh));

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);

#if 0  /* we don't buffer the duplicate, at least not at the moment. */
    if (origfh->buffer != NULL)
    {
        newfh->buffer = (PHYSFS_uint8 *) allocator.Malloc(origfh->bufsize);
        if (!newfh->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
        newfh->bufsize = origfh->bufsize;
    } /* if */
#endif

    newfh->io = origfh->io->duplicate(origfh->io);
    GOTO_IF_ERRPASS(!newfh->io, handleIo_dupe_failed);

    newfh->forReading = origfh->forReading;
    newfh->dirHandle = origfh->dirHandle;

    __PHYSFS_platformGrabMutex(stateLock);
    if (newfh->forReading)
    {
        newfh->next = openReadList;
        openReadList = newfh;
    } /* if */
    else
    {
        newfh->next = openWriteList;
        openWriteList = newfh;
    } /* else */
    __PHYSFS_platformReleaseMutex(stateLock);

    memcpy(retval, io, sizeof (PHYSFS_Io));
    retval->opaque = newfh;
    return retval;
    
handleIo_dupe_failed:
    if (newfh)
    {
        if (newfh->io != NULL) newfh->io->destroy(newfh->io);
        if (newfh->buffer != NULL) allocator.Free(newfh->buffer);
        allocator.Free(newfh);
    } /* if */

    return NULL;
}